

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

Emb_Man_t * Emb_ManStart(Gia_Man_t *pGia)

{
  Emb_Man_t *pEVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  void *pvVar7;
  Gia_Obj_t *pGVar8;
  Emb_Obj_t *pObj_00;
  Emb_Obj_t *pEVar9;
  bool bVar10;
  uint local_70;
  int local_6c;
  int hHandle;
  int k;
  int i;
  int nNodes;
  int nFanios;
  int nObjs;
  Vec_Int_t *vVisit;
  Vec_Int_t *vSuper;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  Emb_Obj_t *pFanLog;
  Emb_Obj_t *pObjLog;
  Emb_Man_t *p;
  Gia_Man_t *pGia_local;
  
  p = (Emb_Man_t *)pGia;
  Emb_ManCreateRefsSpecial(pGia);
  Emb_ManTransformRefs((Gia_Man_t *)p,&nNodes,&i);
  Gia_ManFillValue((Gia_Man_t *)p);
  pObjLog = (Emb_Obj_t *)calloc(1,0x68);
  *(Emb_Man_t **)pObjLog = p;
  iVar2 = Gia_ManRegNum((Gia_Man_t *)p);
  pObjLog[1].hHandle = iVar2;
  iVar2 = Gia_ManCiNum((Gia_Man_t *)p);
  pVVar6 = Vec_IntAlloc(iVar2);
  *(Vec_Int_t **)&pObjLog->hHandle = pVVar6;
  iVar2 = Gia_ManCoNum((Gia_Man_t *)p);
  pVVar6 = Vec_IntAlloc(iVar2);
  *(Vec_Int_t **)&pObjLog->field_8 = pVVar6;
  iVar2 = nNodes * 5;
  iVar3 = Gia_ManRegNum((Gia_Man_t *)p);
  iVar4 = Gia_ManCoNum((Gia_Man_t *)p);
  pObjLog[2].hHandle = iVar2 + (i + iVar3 + iVar4) * 2;
  pvVar7 = calloc((long)pObjLog[2].hHandle,4);
  *(void **)(pObjLog + 2) = pvVar7;
  pGVar8 = Gia_ManConst0((Gia_Man_t *)p);
  pGVar8->Value = 0;
  pFanLog = Emb_ManObj((Emb_Man_t *)pObjLog,0);
  pFanLog->hHandle = 0;
  iVar2 = Gia_ManCoNum((Gia_Man_t *)p);
  pEVar1 = p;
  *(uint *)pFanLog = *(uint *)pFanLog & 0xf | iVar2 << 4;
  pGVar8 = Gia_ManConst0((Gia_Man_t *)p);
  uVar5 = Gia_ObjRefNum((Gia_Man_t *)pEVar1,pGVar8);
  pFanLog->nFanouts = uVar5;
  local_70 = Emb_ObjSize(pFanLog);
  k = 1;
  pObjLog[1].nFanouts = pObjLog[1].nFanouts + 1;
  hHandle = 0;
  while( true ) {
    iVar2 = Vec_IntSize(*(Vec_Int_t **)&p->nReached);
    bVar10 = false;
    if (hHandle < iVar2) {
      pObjRi = Gia_ManCi((Gia_Man_t *)p,hHandle);
      bVar10 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    pObjRi->Value = local_70;
    Vec_IntPush(*(Vec_Int_t **)&pObjLog->hHandle,local_70);
    pFanLog = Emb_ManObj((Emb_Man_t *)pObjLog,local_70);
    pFanLog->hHandle = local_70;
    iVar2 = Gia_ObjIsRo((Gia_Man_t *)p,pObjRi);
    *(uint *)pFanLog = *(uint *)pFanLog & 0xf | iVar2 << 4;
    uVar5 = Gia_ObjRefNum((Gia_Man_t *)p,pObjRi);
    pFanLog->nFanouts = uVar5;
    *(uint *)pFanLog = *(uint *)pFanLog & 0xfffffffe | 1;
    iVar2 = Emb_ObjSize(pFanLog);
    local_70 = iVar2 + local_70;
    pObjLog[1].nFanouts = pObjLog[1].nFanouts + 1;
    hHandle = hHandle + 1;
  }
  vVisit = Vec_IntAlloc(100);
  _nFanios = Vec_IntAlloc(100);
  hHandle = 0;
  while( true ) {
    bVar10 = false;
    if (hHandle < p->nObjs) {
      pObjRi = Gia_ManObj((Gia_Man_t *)p,hHandle);
      bVar10 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    iVar2 = Gia_ObjIsAnd(pObjRi);
    if (iVar2 != 0) {
      if ((*(ulong *)pObjRi >> 0x1e & 1) == 0) {
        iVar2 = Gia_ObjRefNum((Gia_Man_t *)p,pObjRi);
        if (iVar2 != 0) {
          __assert_fail("Gia_ObjRefNum( pGia, pObj ) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                        ,0x222,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
        }
      }
      else {
        iVar2 = Gia_ObjRefNum((Gia_Man_t *)p,pObjRi);
        if (iVar2 < 1) {
          __assert_fail("Gia_ObjRefNum( pGia, pObj ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                        ,0x225,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
        }
        Emb_ManCollectSuper((Gia_Man_t *)p,pObjRi,vVisit,_nFanios);
        pObjRi->Value = local_70;
        pFanLog = Emb_ManObj((Emb_Man_t *)pObjLog,local_70);
        pFanLog->hHandle = local_70;
        iVar2 = Vec_IntSize(vVisit);
        *(uint *)pFanLog = *(uint *)pFanLog & 0xf | iVar2 << 4;
        uVar5 = Gia_ObjRefNum((Gia_Man_t *)p,pObjRi);
        pFanLog->nFanouts = uVar5;
        local_6c = 0;
        while( true ) {
          iVar2 = Vec_IntSize(vVisit);
          pEVar1 = p;
          bVar10 = false;
          if (local_6c < iVar2) {
            iVar2 = Vec_IntEntry(vVisit,local_6c);
            vSuper = (Vec_Int_t *)Gia_ManObj((Gia_Man_t *)pEVar1,iVar2);
            bVar10 = vSuper != (Vec_Int_t *)0x0;
          }
          pEVar9 = pObjLog;
          if (!bVar10) break;
          uVar5 = Gia_ObjValue((Gia_Obj_t *)vSuper);
          pObj = (Gia_Obj_t *)Emb_ManObj((Emb_Man_t *)pEVar9,uVar5);
          Emb_ObjAddFanin(pFanLog,(Emb_Obj_t *)pObj);
          local_6c = local_6c + 1;
        }
        iVar2 = Emb_ObjSize(pFanLog);
        local_70 = iVar2 + local_70;
        k = k + 1;
        pObjLog[1].nFanouts = pObjLog[1].nFanouts + 1;
      }
    }
    hHandle = hHandle + 1;
  }
  Vec_IntFree(vVisit);
  Vec_IntFree(_nFanios);
  hHandle = 0;
  while( true ) {
    iVar2 = Vec_IntSize((Vec_Int_t *)p->pMatr);
    bVar10 = false;
    if (hHandle < iVar2) {
      pObjRi = Gia_ManCo((Gia_Man_t *)p,hHandle);
      bVar10 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    pObjRi->Value = local_70;
    Vec_IntPush(*(Vec_Int_t **)&pObjLog->field_8,local_70);
    pFanLog = Emb_ManObj((Emb_Man_t *)pObjLog,local_70);
    pFanLog->hHandle = local_70;
    *(uint *)pFanLog = *(uint *)pFanLog & 0xf | 0x10;
    iVar2 = Gia_ObjIsRi((Gia_Man_t *)p,pObjRi);
    pEVar9 = pObjLog;
    pFanLog->nFanouts = iVar2 + 1;
    *(uint *)pFanLog = *(uint *)pFanLog & 0xfffffffd | 2;
    pGVar8 = Gia_ObjFanin0(pObjRi);
    uVar5 = Gia_ObjValue(pGVar8);
    pObj = (Gia_Obj_t *)Emb_ManObj((Emb_Man_t *)pEVar9,uVar5);
    Emb_ObjAddFanin(pFanLog,(Emb_Obj_t *)pObj);
    iVar2 = Emb_ObjSize(pFanLog);
    local_70 = iVar2 + local_70;
    pObjLog[1].nFanouts = pObjLog[1].nFanouts + 1;
    hHandle = hHandle + 1;
  }
  hHandle = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum((Gia_Man_t *)p);
    pEVar1 = p;
    bVar10 = false;
    if (hHandle < iVar2) {
      iVar2 = Gia_ManPoNum((Gia_Man_t *)p);
      pObjRo = Gia_ManCo((Gia_Man_t *)pEVar1,iVar2 + hHandle);
      pEVar1 = p;
      bVar10 = false;
      if (pObjRo != (Gia_Obj_t *)0x0) {
        iVar2 = Gia_ManPiNum((Gia_Man_t *)p);
        pFanin = Gia_ManCi((Gia_Man_t *)pEVar1,iVar2 + hHandle);
        bVar10 = pFanin != (Gia_Obj_t *)0x0;
      }
    }
    pEVar9 = pObjLog;
    if (!bVar10) break;
    uVar5 = Gia_ObjValue(pFanin);
    pObj_00 = Emb_ManObj((Emb_Man_t *)pEVar9,uVar5);
    pEVar9 = pObjLog;
    uVar5 = Gia_ObjValue(pObjRo);
    pEVar9 = Emb_ManObj((Emb_Man_t *)pEVar9,uVar5);
    Emb_ObjAddFanin(pObj_00,pEVar9);
    hHandle = hHandle + 1;
  }
  Gia_ManCleanMark0((Gia_Man_t *)p);
  iVar2 = Emb_ManNodeNum((Emb_Man_t *)pObjLog);
  if (k != iVar2) {
    __assert_fail("nNodes == Emb_ManNodeNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                  ,0x250,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
  }
  if (nNodes != pObjLog[1].nFanouts) {
    __assert_fail("nObjs == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                  ,0x251,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
  }
  if (local_70 != pObjLog[2].hHandle) {
    __assert_fail("hHandle == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                  ,0x252,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
  }
  if (local_70 != pObjLog[2].hHandle) {
    printf("Emb_ManStart(): Fatal error in internal representation.\n");
  }
  hHandle = 0;
  do {
    bVar10 = false;
    if (hHandle < p->nObjs) {
      pObjRi = Gia_ManObj((Gia_Man_t *)p,hHandle);
      bVar10 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) {
      if (p[1].pObjData != (int *)0x0) {
        free(p[1].pObjData);
        p[1].pObjData = (int *)0x0;
      }
      return (Emb_Man_t *)pObjLog;
    }
    iVar2 = Gia_ObjValue(pObjRi);
    pEVar9 = pObjLog;
    if (iVar2 != -1) {
      uVar5 = Gia_ObjValue(pObjRi);
      pFanLog = Emb_ManObj((Emb_Man_t *)pEVar9,uVar5);
      if ((*(uint *)pFanLog >> 4 != (pFanLog->field_7).TravId) &&
         (iVar2 = Gia_ObjIsConst0(pObjRi), iVar2 == 0)) {
        __assert_fail("pObjLog->nFanins == pObjLog->iFanin || Gia_ObjIsConst0(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                      ,0x25b,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
      }
      if ((pFanLog->nFanouts != (pFanLog->field_8).Value) &&
         (iVar2 = Gia_ObjIsCo(pObjRi), iVar2 == 0)) {
        __assert_fail("pObjLog->nFanouts == pObjLog->iFanout || Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                      ,0x25c,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
      }
      (pFanLog->field_8).Value = 0;
      (pFanLog->field_7).TravId = 0;
    }
    hHandle = hHandle + 1;
  } while( true );
}

Assistant:

Emb_Man_t * Emb_ManStart( Gia_Man_t * pGia )
{
    Emb_Man_t * p;
    Emb_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo, * pFanin;
    Vec_Int_t * vSuper, * vVisit;
    int nObjs, nFanios, nNodes = 0;
    int i, k, hHandle = 0;
    // prepare the AIG
//    Gia_ManCreateRefs( pGia );
    Emb_ManCreateRefsSpecial( pGia );
    Emb_ManTransformRefs( pGia, &nObjs, &nFanios );
    Gia_ManFillValue( pGia );
    // create logic network
    p = ABC_CALLOC( Emb_Man_t, 1 );
    p->pGia  = pGia;
    p->nRegs = Gia_ManRegNum(pGia);
    p->vCis  = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos  = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Emb_Obj_t) / 4) * nObjs + 2 * (nFanios + Gia_ManRegNum(pGia) + Gia_ManCoNum(pGia));
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    // create constant node
    Gia_ManConst0(pGia)->Value = hHandle;
    pObjLog = Emb_ManObj( p, hHandle );
    pObjLog->hHandle  = hHandle;
    pObjLog->nFanins  = Gia_ManCoNum(pGia);  //0;
    pObjLog->nFanouts = Gia_ObjRefNum( pGia, Gia_ManConst0(pGia) );
    // count objects
    hHandle += Emb_ObjSize( pObjLog );
    nNodes++;
    p->nObjs++;
    // create the PIs
    Gia_ManForEachCi( pGia, pObj, i )
    {
        // create PI object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCis, hHandle );
        pObjLog = Emb_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = Gia_ObjIsRo( pGia, pObj );
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->fCi = 1;
        // count objects
        hHandle += Emb_ObjSize( pObjLog );
        p->nObjs++;
    }
    // create internal nodes
    vSuper = Vec_IntAlloc( 100 );
    vVisit = Vec_IntAlloc( 100 );
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( pObj->fMark0 == 0 )
        {
            assert( Gia_ObjRefNum( pGia, pObj ) == 0 );
            continue;
        }
        assert( Gia_ObjRefNum( pGia, pObj ) > 0 );
        Emb_ManCollectSuper( pGia, pObj, vSuper, vVisit );
        // create node object
        pObj->Value = hHandle;
        pObjLog = Emb_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = Vec_IntSize( vSuper );
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        // add fanins
        Gia_ManForEachObjVec( vSuper, pGia, pFanin, k )
        {
            pFanLog = Emb_ManObj( p, Gia_ObjValue(pFanin) ); 
            Emb_ObjAddFanin( pObjLog, pFanLog );
        }
        // count objects
        hHandle += Emb_ObjSize( pObjLog );
        nNodes++;
        p->nObjs++;
    }
    Vec_IntFree( vSuper );
    Vec_IntFree( vVisit );
    // create the POs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        // create PO object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCos, hHandle );
        pObjLog = Emb_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 1;
        pObjLog->nFanouts = 1 + Gia_ObjIsRi( pGia, pObj );
        pObjLog->fCo = 1;
        // add fanins
        pFanLog = Emb_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Emb_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Emb_ObjSize( pObjLog );
        p->nObjs++;
    }
    // connect registers
    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, i )
        Emb_ObjAddFanin( Emb_ManObj(p,Gia_ObjValue(pObjRo)), Emb_ManObj(p,Gia_ObjValue(pObjRi)) );
    Gia_ManCleanMark0( pGia );
    assert( nNodes  == Emb_ManNodeNum(p) );
    assert( nObjs   == p->nObjs );
    assert( hHandle == p->nObjData );
    if ( hHandle != p->nObjData )
        printf( "Emb_ManStart(): Fatal error in internal representation.\n" );
    // make sure the fanin/fanout counters are correct
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !~Gia_ObjValue(pObj) )
            continue;
        pObjLog = Emb_ManObj( p, Gia_ObjValue(pObj) );
        assert( pObjLog->nFanins  == pObjLog->iFanin || Gia_ObjIsConst0(pObj) );
        assert( pObjLog->nFanouts == pObjLog->iFanout || Gia_ObjIsCo(pObj) );
        pObjLog->iFanin = pObjLog->iFanout = 0;
    }
    ABC_FREE( pGia->pRefs );
    return p;
}